

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsPrimaryTypes.cpp
# Opt level: O3

void helics::valueExtract(data_view *data,DataType baseType,string *val)

{
  vector<double,_std::allocator<double>_> *val_00;
  vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *val_01;
  NamedPoint *point;
  basic_string_view<char,_std::char_traits<char>_> val_1;
  string local_68;
  _Variadic_union<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
  local_48;
  
  switch(baseType) {
  case HELICS_DOUBLE:
    valueExtract();
    break;
  case HELICS_INT:
  case HELICS_TIME:
    valueExtract();
    break;
  case HELICS_COMPLEX:
    valueExtract();
    break;
  case HELICS_VECTOR:
    ValueConverter<std::vector<double,_std::allocator<double>_>_>::interpret
              ((vector<double,_std::allocator<double>_> *)&local_68,data);
    helicsVectorString_abi_cxx11_((string *)&local_48._M_first,(helics *)&local_68,val_00);
    valueExtract();
    break;
  case HELICS_COMPLEX_VECTOR:
    ValueConverter<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>::
    interpret((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)&local_68,data
             );
    helicsComplexVectorString_abi_cxx11_((string *)&local_48._M_first,(helics *)&local_68,val_01);
    valueExtract();
    break;
  case HELICS_NAMED_POINT:
    ValueConverter<helics::NamedPoint>::interpret((NamedPoint *)&local_48._M_first,data);
    if (NAN((double)local_48._32_8_)) {
      local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_68,local_48._M_first._M_storage,
                 local_48._8_8_ + (long)local_48._M_first._M_storage);
    }
    else {
      helicsNamedPointString_abi_cxx11_(&local_68,(helics *)&local_48._M_first,point);
    }
    valueExtract();
    break;
  case HELICS_TIME|HELICS_INT:
  case HELICS_TIME|HELICS_COMPLEX:
  case HELICS_TIME|HELICS_VECTOR:
  case HELICS_TIME|HELICS_COMPLEX_VECTOR:
  case HELICS_TIME|HELICS_NAMED_POINT:
  case HELICS_TIME|HELICS_BOOL:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x1a:
  case 0x1b:
  case 0x1c:
  case 0x1d:
  case HELICS_JSON|HELICS_DOUBLE:
  case 0x20:
    break;
  case HELICS_JSON:
    readJsonValue_abi_cxx11_
              ((defV *)&local_48._M_first,(helics *)data,
               (data_view *)&switchD_002887b3::switchdataD_0043a704);
    valueExtract((defV *)&local_48._M_first,val);
    std::__detail::__variant::
    _Variant_storage<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
    ::~_Variant_storage((_Variant_storage<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                         *)&local_48._M_first);
    break;
  case HELICS_UNKNOWN:
  case HELICS_CUSTOM:
  case HELICS_MULTI:
    valueExtract();
    break;
  default:
    if (baseType != HELICS_ANY) {
      return;
    }
  case HELICS_STRING:
  case HELICS_BOOL:
  case HELICS_CHAR:
    local_48._M_first._M_storage = (_Uninitialized<double,_true>)0.0;
    local_48._8_8_ = (char *)0x0;
    detail::convertFromBinary((byte *)(data->dblock)._M_str,(string_view *)&local_48._M_first);
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_replace
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)val,0,
               val->_M_string_length,(char *)local_48._8_8_,(size_type)local_48._M_first._M_storage)
    ;
  }
  return;
}

Assistant:

void valueExtract(const data_view& data, DataType baseType, std::string& val)
{
    switch (baseType) {
        case DataType::HELICS_DOUBLE: {
            auto value = ValueConverter<double>::interpret(data);
            val = helicsDoubleString(value);
            break;
        }
        case DataType::HELICS_INT:
        case DataType::HELICS_TIME: {
            auto value = ValueConverter<int64_t>::interpret(data);
            val = helicsIntString(value);
            break;
        }
        case DataType::HELICS_STRING:
        case DataType::HELICS_CHAR:
        case DataType::HELICS_BOOL:
        case DataType::HELICS_ANY:
            val = ValueConverter<std::string_view>::interpret(data);
            break;
        case DataType::HELICS_UNKNOWN:
        case DataType::HELICS_CUSTOM:
        case DataType::HELICS_MULTI:
            val = data.string();
            break;
        case DataType::HELICS_NAMED_POINT: {
            auto npv = ValueConverter<NamedPoint>::interpret(data);
            val = std::isnan(npv.value) ? npv.name : helicsNamedPointString(npv);
            break;
        }
        case DataType::HELICS_VECTOR:
            val = helicsVectorString(ValueConverter<std::vector<double>>::interpret(data));
            break;
        case DataType::HELICS_COMPLEX:
            val = helicsComplexString(ValueConverter<std::complex<double>>::interpret(data));
            break;
        case DataType::HELICS_COMPLEX_VECTOR:
            val = helicsComplexVectorString(
                ValueConverter<std::vector<std::complex<double>>>::interpret(data));
            break;
        case DataType::HELICS_JSON:
            valueExtract(readJsonValue(data), val);
            break;
    }
}